

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixError(anon_unknown_1 *this,string *context,int error_number)

{
  char *pcVar1;
  Slice local_60;
  Slice local_50;
  Slice local_40;
  Slice local_30;
  int local_1c;
  string *psStack_18;
  int error_number_local;
  string *context_local;
  
  local_1c = error_number;
  psStack_18 = context;
  context_local = (string *)this;
  if (error_number == 2) {
    Slice::Slice(&local_30,context);
    pcVar1 = strerror(local_1c);
    Slice::Slice(&local_40,pcVar1);
    Status::NotFound((Status *)this,&local_30,&local_40);
  }
  else {
    Slice::Slice(&local_50,context);
    pcVar1 = strerror(local_1c);
    Slice::Slice(&local_60,pcVar1);
    Status::IOError((Status *)this,&local_50,&local_60);
  }
  return (Status)(char *)this;
}

Assistant:

Status PosixError(const std::string& context, int error_number) {
  if (error_number == ENOENT) {
    return Status::NotFound(context, std::strerror(error_number));
  } else {
    return Status::IOError(context, std::strerror(error_number));
  }
}